

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DashTests.cpp
# Opt level: O1

void __thiscall agge::tests::DashTests::ThePatternIsAppliedPeriodically(DashTests *this)

{
  undefined8 uVar1;
  long lVar2;
  undefined8 *puVar3;
  point *ppVar4;
  byte bVar5;
  point reference2 [5];
  dash d;
  point reference1 [7];
  undefined1 local_1f8 [8];
  int iStack_1f0;
  real_t rStack_1ec;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  point pStack_1d8;
  int local_1cc;
  real_t rStack_1c8;
  undefined8 uStack_1c4;
  dash local_1b0;
  undefined1 local_158 [44];
  int local_12c;
  pointer local_128;
  int local_120;
  point local_118 [6];
  undefined4 local_c8;
  point local_b8;
  point local_ac;
  point local_a0;
  point local_94;
  point local_88;
  point local_7c;
  point local_70 [2];
  string local_58;
  LocationInfo local_38;
  
  bVar5 = 0;
  dash::dash(&local_1b0);
  dash::add_dash(&local_1b0,5.0,10.0);
  dash::add_vertex(&local_1b0,0.0,0.0,1);
  dash::add_vertex(&local_1b0,44.99,0.0,2);
  local_118[0].command = 0;
  local_118[0].x = 0.0;
  local_118[0].y = 0.0;
  local_b8.command = dash::vertex(&local_1b0,&local_118[0].x,&local_118[0].y);
  local_b8.x = local_118[0].x;
  local_b8.y = local_118[0].y;
  local_118[0].command = 0;
  local_118[0].x = 0.0;
  local_118[0].y = 0.0;
  local_ac.command = dash::vertex(&local_1b0,&local_118[0].x,&local_118[0].y);
  local_ac.x = local_118[0].x;
  local_ac.y = local_118[0].y;
  local_118[0].command = 0;
  local_118[0].x = 0.0;
  local_118[0].y = 0.0;
  local_a0.command = dash::vertex(&local_1b0,&local_118[0].x,&local_118[0].y);
  local_a0.x = local_118[0].x;
  local_a0.y = local_118[0].y;
  local_118[0].command = 0;
  local_118[0].x = 0.0;
  local_118[0].y = 0.0;
  local_94.command = dash::vertex(&local_1b0,&local_118[0].x,&local_118[0].y);
  local_94.x = local_118[0].x;
  local_94.y = local_118[0].y;
  local_118[0].command = 0;
  local_118[0].x = 0.0;
  local_118[0].y = 0.0;
  local_88.command = dash::vertex(&local_1b0,&local_118[0].x,&local_118[0].y);
  local_88.x = local_118[0].x;
  local_88.y = local_118[0].y;
  local_118[0].command = 0;
  local_118[0].x = 0.0;
  local_118[0].y = 0.0;
  local_7c.command = dash::vertex(&local_1b0,&local_118[0].x,&local_118[0].y);
  local_7c.x = local_118[0].x;
  local_7c.y = local_118[0].y;
  local_118[0].command = 0;
  local_118[0].x = 0.0;
  local_118[0].y = 0.0;
  local_70[0].command = dash::vertex(&local_1b0,&local_118[0].x,&local_118[0].y);
  local_70[0].x = local_118[0].x;
  local_70[0].y = local_118[0].y;
  puVar3 = &DAT_0019e920;
  ppVar4 = local_118;
  for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
    uVar1 = *puVar3;
    ppVar4->x = (real_t)(int)uVar1;
    ppVar4->y = (real_t)(int)((ulong)uVar1 >> 0x20);
    puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
    ppVar4 = (point *)((long)ppVar4 + ((ulong)bVar5 * -2 + 1) * 8);
  }
  local_c8 = 0;
  local_1f8 = (undefined1  [8])&local_1e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1f8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/DashTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)local_158,(string *)local_1f8,0x8c);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,7ul>
            ((point (*) [7])local_118,(point (*) [7])&local_b8,(LocationInfo *)local_158);
  if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
    operator_delete((void *)local_158._0_8_);
  }
  if (local_1f8 != (undefined1  [8])&local_1e8) {
    operator_delete((void *)local_1f8);
  }
  dash::remove_all_dashes(&local_1b0);
  dash::add_dash(&local_1b0,5.0,7.0);
  dash::remove_all(&local_1b0);
  dash::add_vertex(&local_1b0,0.0,0.0,1);
  dash::add_vertex(&local_1b0,24.0,0.0,2);
  iStack_1f0 = 0;
  local_1f8 = (undefined1  [8])0x0;
  local_158._8_4_ = dash::vertex(&local_1b0,(real_t *)local_1f8,(real_t *)(local_1f8 + 4));
  local_158._0_8_ = local_1f8;
  iStack_1f0 = 0;
  local_1f8 = (undefined1  [8])0x0;
  local_158._20_4_ = dash::vertex(&local_1b0,(real_t *)local_1f8,(real_t *)(local_1f8 + 4));
  local_158._12_8_ = local_1f8;
  iStack_1f0 = 0;
  local_1f8 = (undefined1  [8])0x0;
  local_158._32_4_ = dash::vertex(&local_1b0,(real_t *)local_1f8,(real_t *)(local_1f8 + 4));
  local_158._24_8_ = local_1f8;
  iStack_1f0 = 0;
  local_1f8 = (undefined1  [8])0x0;
  local_12c = dash::vertex(&local_1b0,(real_t *)local_1f8,(real_t *)(local_1f8 + 4));
  local_158._36_8_ = local_1f8;
  iStack_1f0 = 0;
  local_1f8 = (undefined1  [8])0x0;
  local_120 = dash::vertex(&local_1b0,(real_t *)local_1f8,(real_t *)(local_1f8 + 4));
  local_128 = (pointer)local_1f8;
  rStack_1c8 = 0.0;
  uStack_1c4._0_4_ = 0.0;
  uStack_1c4._4_4_ = 0;
  pStack_1d8.x = 1.4013e-45;
  pStack_1d8.y = 17.0;
  pStack_1d8.command = 0;
  local_1cc = 2;
  local_1e8._M_allocated_capacity = 0x200000000;
  local_1e8._8_8_ = 0x41400000;
  local_1f8 = (undefined1  [8])0x0;
  iStack_1f0 = 1;
  rStack_1ec = 5.0;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/DashTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_38,&local_58,0xa5);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,5ul>
            ((point (*) [5])local_1f8,(point (*) [5])local_158,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.filename._M_dataplus._M_p != &local_38.filename.field_2) {
    operator_delete(local_38.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if (local_1b0._pattern._begin != (dash_gap *)0x0) {
    operator_delete__(local_1b0._pattern._begin);
  }
  if (local_1b0.super_vertex_sequence.super_pod_vector<agge::vertex>._begin != (vertex *)0x0) {
    operator_delete__(local_1b0.super_vertex_sequence.super_pod_vector<agge::vertex>._begin);
  }
  return;
}

Assistant:

test( ThePatternIsAppliedPeriodically )
			{
				// INIT
				dash d;

				d.add_dash(5.0f, 10.0f);

				// ACT
				move_to(d, 0.0f, 0.0f);
				line_to(d, 44.99f, 0.0f);
				mocks::path::point result1[] = {
					vertex(d), vertex(d),
					vertex(d), vertex(d),
					vertex(d), vertex(d),
					vertex(d),
				};

				// ASSERT
				mocks::path::point reference1[] = {
					{ 0.0f, 0.0f, path_command_move_to },
					{ 5.0f, 0.0f, path_command_line_to },
					{ 15.0f, 0.0f, path_command_move_to },
					{ 20.0f, 0.0f, path_command_line_to },
					{ 30.0f, 0.0f, path_command_move_to },
					{ 35.0f, 0.0f, path_command_line_to },
					{ 0.0f, 0.0f, path_command_stop },
				};

				assert_equal(reference1, result1);

				// INIT
				d.remove_all_dashes();
				d.add_dash(5.0f, 7.0f);
				d.remove_all();

				// ACT (pattern end coincides with segment end)
				move_to(d, 0.0f, 0.0f);
				line_to(d, 24.0f, 0.0f);
				mocks::path::point result2[] = {
					vertex(d), vertex(d),
					vertex(d), vertex(d),
					vertex(d),
				};

				// ASSERT
				mocks::path::point reference2[] = {
					{ 0.0f, 0.0f, path_command_move_to },
					{ 5.0f, 0.0f, path_command_line_to },
					{ 12.0f, 0.0f, path_command_move_to },
					{ 17.0f, 0.0f, path_command_line_to },
					{ 0.0f, 0.0f, path_command_stop },
				};

				assert_equal(reference2, result2);
			}